

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_compare_and_swap_
               (void *origin_addr,void *compare_addr,void *result_addr,MPIABI_Fint *datatype,
               MPIABI_Fint *target_rank,MPIABI_Fint *target_disp,MPIABI_Fint *win,
               MPIABI_Fint *ierror)

{
  mpi_compare_and_swap_();
  return;
}

Assistant:

void mpiabi_compare_and_swap_(
  const void * origin_addr,
  const void * compare_addr,
  void * result_addr,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * target_rank,
  const MPIABI_Fint * target_disp,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_compare_and_swap_(
    origin_addr,
    compare_addr,
    result_addr,
    datatype,
    target_rank,
    target_disp,
    win,
    ierror
  );
}